

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  uchar uVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  time_t start_time;
  ssize_t sVar6;
  size_t sVar7;
  char *pcVar8;
  ulong banner_len;
  char local_6d;
  libssh2_socket_t local_6c;
  time_t local_68;
  uchar *local_60;
  uchar *local_58;
  key_exchange_state_t *local_50;
  packet_require_state_t *local_48;
  uchar **local_40;
  uchar *local_38;
  
  local_6c = sock;
  start_time = time((time_t *)0x0);
  local_50 = &session->startup_key_state;
  local_38 = session->startup_service;
  local_58 = session->startup_service + 1;
  local_60 = session->startup_service + 5;
  local_40 = &session->startup_data;
  local_48 = &session->startup_req_state;
LAB_0011113b:
  switch(session->startup_state) {
  case libssh2_NB_state_idle:
    if (local_6c == -1) {
      iVar4 = -0x2d;
      pcVar8 = "Bad socket provided";
    }
    else {
      session->socket_fd = local_6c;
      uVar3 = fcntl(local_6c,3,0);
      uVar3 = uVar3 >> 0xb & 1;
      session->socket_prev_blockstate = uVar3 ^ 1;
      if ((uVar3 != 0) || (iVar4 = session_nonblock(session->socket_fd,1), iVar4 == 0)) {
        session->startup_state = libssh2_NB_state_created;
        goto switchD_00111159_caseD_2;
      }
      pcVar8 = "Failed changing socket\'s blocking state to non-blocking";
    }
    goto LAB_001115fd;
  default:
    return -0x22;
  case libssh2_NB_state_created:
switchD_00111159_caseD_2:
    pcVar8 = "SSH-2.0-libssh2_1.11.1_DEV\r\n";
    sVar7 = 0x1c;
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      puVar2 = (session->local).banner;
      pcVar8 = "SSH-2.0-libssh2_1.11.1_DEV\r\n";
      local_68 = start_time;
      if (puVar2 != (uchar *)0x0) {
        sVar7 = strlen((char *)puVar2);
        pcVar8 = (char *)puVar2;
      }
      session->banner_TxRx_state = libssh2_NB_state_created;
      start_time = local_68;
    }
    *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfd;
    sVar6 = (*session->send)(session->socket_fd,(uchar *)pcVar8 + session->banner_TxRx_total_send,
                             sVar7 - session->banner_TxRx_total_send,
                             (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
    if (sVar6 == sVar7 - session->banner_TxRx_total_send) {
      session->banner_TxRx_total_send = 0;
      session->startup_state = libssh2_NB_state_sent;
      session->banner_TxRx_state = libssh2_NB_state_idle;
      break;
    }
    if (sVar6 < 0 && sVar6 != -0xb) {
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
      iVar4 = -0x2b;
      pcVar8 = "Failed sending banner";
      goto LAB_001115fd;
    }
    session->socket_block_directions = 2;
    if (0 < sVar6) {
      session->banner_TxRx_total_send = session->banner_TxRx_total_send + sVar6;
    }
    goto LAB_00111607;
  case libssh2_NB_state_sent:
    break;
  case libssh2_NB_state_sent1:
    goto switchD_00111159_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00111159_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_00111159_caseD_6;
  case libssh2_NB_state_sent4:
    goto switchD_00111159_caseD_7;
  }
  do {
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      puVar2 = (session->remote).banner;
      if (puVar2 != (uchar *)0x0) {
        (*session->free)(puVar2,&session->abstract);
      }
      (session->remote).banner = (uchar *)0x0;
      session->banner_TxRx_state = libssh2_NB_state_created;
      banner_len = 0;
    }
    else {
      banner_len = session->banner_TxRx_total_send;
    }
LAB_0011129c:
    do {
      local_6d = '\0';
      *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfe;
      sVar6 = (*session->recv)(session->socket_fd,&local_6d,1,
                               (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
      if (sVar6 < 0) {
        if (sVar6 == -0xb) {
          session->socket_block_directions = 1;
          session->banner_TxRx_total_send = banner_len;
          iVar4 = -0x25;
        }
        else {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar4 = -0x2b;
        }
        goto LAB_001113dc;
      }
      if (sVar6 == 0) {
        session->socket_state = -1;
        iVar4 = -0xd;
        goto LAB_001113dc;
      }
      if (banner_len == 0 && (local_6d == '\n' || local_6d == '\r')) {
        banner_len = 0;
        if ((session->remote).banner == (uchar *)0x0) goto LAB_0011129c;
      }
      else {
        if (local_6d == '\0') {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar4 = -2;
          goto LAB_001113dc;
        }
        if (0xff < banner_len) {
          iVar4 = collect_remote_banner(session,banner_len);
          if (iVar4 < 0) goto LAB_001113dc;
          banner_len = 0;
        }
      }
      session->banner_TxRx_banner[banner_len] = local_6d;
      banner_len = banner_len + 1;
    } while (local_6d != '\n');
    iVar4 = collect_remote_banner(session,banner_len);
    if (-1 < iVar4) {
      sVar7 = strlen((char *)(session->remote).banner);
      while (sVar7 != 0) {
        puVar2 = (session->remote).banner;
        uVar1 = puVar2[sVar7 - 1];
        if ((uVar1 != '\r') && (uVar1 != '\n')) {
          iVar4 = 0;
          goto LAB_00111407;
        }
        puVar2[sVar7 - 1] = '\0';
        sVar7 = sVar7 - 1;
      }
      iVar4 = -2;
LAB_00111407:
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
    }
LAB_001113dc:
    if (iVar4 != 0) {
      if (iVar4 == -0x25) goto LAB_00111607;
      pcVar8 = "Failed getting banner";
      goto LAB_001115fd;
    }
    iVar4 = strncmp("SSH-",(char *)(session->remote).banner,4);
  } while (iVar4 != 0);
  session->startup_state = libssh2_NB_state_sent1;
switchD_00111159_caseD_4:
  iVar4 = _libssh2_kex_exchange(session,0,local_50);
  if (iVar4 != -0x25) {
    if (iVar4 == 0) {
      session->startup_state = libssh2_NB_state_sent2;
switchD_00111159_caseD_5:
      session->startup_service[0] = '\x05';
      _libssh2_htonu32(local_58,0xc);
      builtin_memcpy(local_60,"ssh-userauth",0xc);
      session->startup_state = libssh2_NB_state_sent3;
switchD_00111159_caseD_6:
      iVar4 = _libssh2_transport_send(session,local_38,0x11,(uchar *)0x0,0);
      if (iVar4 == -0x25) goto LAB_00111607;
      if (iVar4 == 0) {
        session->startup_state = libssh2_NB_state_sent4;
switchD_00111159_caseD_7:
        iVar4 = _libssh2_packet_require
                          (session,'\x06',local_40,&session->startup_data_len,0,(uchar *)0x0,0,
                           local_48);
        if (iVar4 == 0) {
          if (session->startup_data_len < 5) {
            iVar4 = -0xe;
            pcVar8 = "Unexpected packet length";
          }
          else {
            uVar5 = _libssh2_ntohu32(session->startup_data + 1);
            session->startup_service_length = (ulong)uVar5;
            puVar2 = session->startup_data;
            if ((uVar5 == 0xc) &&
               (iVar4 = strncmp("ssh-userauth",(char *)(puVar2 + 5),0xc), iVar4 == 0)) {
              (*session->free)(puVar2,&session->abstract);
              session->startup_data = (uchar *)0x0;
              session->startup_state = libssh2_NB_state_idle;
              return 0;
            }
            (*session->free)(puVar2,&session->abstract);
            session->startup_data = (uchar *)0x0;
            iVar4 = -0xe;
            pcVar8 = "Invalid response received from server";
          }
        }
        else {
          pcVar8 = "Failed to get response to ssh-userauth request";
        }
      }
      else {
        pcVar8 = "Unable to ask for ssh-userauth service";
      }
    }
    else {
      pcVar8 = "Unable to exchange encryption keys";
    }
LAB_001115fd:
    iVar4 = _libssh2_error(session,iVar4,pcVar8);
    if (iVar4 != -0x25) {
      return iVar4;
    }
  }
LAB_00111607:
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar4 = _libssh2_wait_socket(session,start_time);
  if (iVar4 != 0) {
    return iVar4;
  }
  goto LAB_0011113b;
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}